

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  sqlite3 *psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  psVar1 = pParse->db;
  iVar3 = psVar1->nDb;
  if (0 < iVar3) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      if (*(long *)((long)&psVar1->aDb->zDbSName + lVar4) != 0) {
        if (zDb != (char *)0x0) {
          iVar2 = sqlite3StrICmp(zDb,*(char **)((long)psVar1->aDb + lVar4 + -8));
          if (iVar2 != 0) goto LAB_0017681e;
        }
        sqlite3CodeVerifySchema(pParse,(int)lVar5);
        iVar3 = psVar1->nDb;
      }
LAB_0017681e:
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}